

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  pointer *this;
  _Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *p_Var1;
  tinyexr_uint64 tVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  undefined1 local_250 [4];
  int ret;
  string e;
  string local_228;
  uint local_204;
  uint *puStack_200;
  uint part_no;
  uchar *part_number_addr;
  uint local_1f0;
  uint dx_1;
  uint dy_1;
  uint l_1;
  OffsetData *offset_data_1;
  size_t i_2;
  string local_1d0;
  pointer local_1b0;
  tinyexr_uint64 offset_1;
  uint dx;
  uint dy;
  uint l;
  int local_178;
  allocator local_171;
  int num_blocks;
  undefined1 local_150 [8];
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  string local_118;
  pointer local_f8;
  tinyexr_uint64 offset;
  size_t c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *offset_table;
  OffsetData *offset_data;
  size_t i_1;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  char *marker;
  string local_a8;
  uint local_84;
  long lStack_80;
  uint i;
  size_t total_header_size;
  allocator local_61;
  string local_60;
  char **local_40;
  char **err_local;
  size_t size_local;
  uchar *memory_local;
  EXRHeader **ppEStack_20;
  uint num_parts_local;
  EXRHeader **exr_headers_local;
  EXRImage *exr_images_local;
  
  local_40 = err;
  err_local = (char **)size;
  size_local = (size_t)memory;
  memory_local._4_4_ = num_parts;
  ppEStack_20 = exr_headers;
  exr_headers_local = (EXRHeader **)exr_images;
  if ((((exr_images == (EXRImage *)0x0) || (exr_headers == (EXRHeader **)0x0)) || (num_parts == 0))
     || ((memory == (uchar *)0x0 || (size < 9)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"Invalid argument for LoadEXRMultipartImageFromMemory()",
               &local_61);
    tinyexr::SetErrorMessage(&local_60,local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    exr_images_local._4_4_ = -3;
  }
  else {
    lStack_80 = 0;
    for (local_84 = 0; local_84 < num_parts; local_84 = local_84 + 1) {
      if (exr_headers[local_84]->header_len == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a8,"EXRHeader variable is not initialized.",
                   (allocator *)((long)&marker + 7));
        tinyexr::SetErrorMessage(&local_a8,local_40);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&marker + 7));
        return -3;
      }
      lStack_80 = (ulong)exr_headers[local_84]->header_len + lStack_80;
    }
    chunk_offset_table_list.
    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(memory + lStack_80 + 9);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::vector
              ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)&i_1);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)&i_1,
               (ulong)memory_local._4_4_);
    for (offset_data = (OffsetData *)0x0; offset_data < (OffsetData *)(ulong)memory_local._4_4_;
        offset_data = (OffsetData *)
                      ((long)&(offset_data->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1)) {
      sVar6 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::size
                        ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)&i_1);
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)&i_1,sVar6 + 1
                );
      offset_table = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::back
                               ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *
                                )&i_1);
      if ((ppEStack_20[(long)offset_data]->tiled == 0) ||
         (ppEStack_20[(long)offset_data]->tile_level_mode == 0)) {
        tinyexr::InitSingleResolutionOffsets
                  ((OffsetData *)offset_table,(long)ppEStack_20[(long)offset_data]->chunk_count);
        pvVar7 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                               *)offset_table,0);
        c = (size_t)std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::operator[](pvVar7,0);
        for (offset = 0; tVar2 = offset,
            sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)c),
            tVar2 < sVar6; offset = offset + 1) {
          local_f8 = ((chunk_offset_table_list.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->offsets).
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          tinyexr::swap8((tinyexr_uint64 *)&local_f8);
          if (err_local <= local_f8) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_118,"Invalid offset size in EXR header chunks.",
                       (allocator *)
                       ((long)&num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            tinyexr::SetErrorMessage(&local_118,local_40);
            std::__cxx11::string::~string((string *)&local_118);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            exr_images_local._4_4_ = -4;
            num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_001100bb;
          }
          p_Var1 = &local_f8->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ;
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)c,offset);
          *pvVar8 = (value_type)((long)&p_Var1->_M_impl + 4);
          chunk_offset_table_list.
          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)&((chunk_offset_table_list.
                           super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else {
        this = &num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
        std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_150);
        bVar4 = tinyexr::PrecalculateTileInfo
                          ((vector<int,_std::allocator<int>_> *)this,
                           (vector<int,_std::allocator<int>_> *)local_150,
                           ppEStack_20[(long)offset_data]);
        if (bVar4) {
          local_178 = tinyexr::InitTileOffsets
                                ((OffsetData *)offset_table,ppEStack_20[(long)offset_data],
                                 (vector<int,_std::allocator<int>_> *)
                                 &num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,
                                 (vector<int,_std::allocator<int>_> *)local_150);
          if (local_178 == ppEStack_20[(long)offset_data]->chunk_count) {
            num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&l,"Invalid offset table size.",(allocator *)((long)&dy + 3));
            tinyexr::SetErrorMessage((string *)&l,local_40);
            std::__cxx11::string::~string((string *)&l);
            std::allocator<char>::~allocator((allocator<char> *)((long)&dy + 3));
            exr_images_local._4_4_ = -4;
            num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&num_blocks,"Invalid tile info.",&local_171);
          tinyexr::SetErrorMessage((string *)&num_blocks,local_40);
          std::__cxx11::string::~string((string *)&num_blocks);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          exr_images_local._4_4_ = -4;
          num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_150);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if ((int)num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage != 0) goto LAB_001100bb;
        for (dx = 0; uVar10 = (ulong)dx,
            sVar6 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::size((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            *)offset_table), uVar10 < sVar6; dx = dx + 1) {
          offset_1._4_4_ = 0;
          while( true ) {
            uVar10 = (ulong)offset_1._4_4_;
            pvVar7 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   *)offset_table,(ulong)dx);
            sVar6 = std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::size(pvVar7);
            if (sVar6 <= uVar10) break;
            offset_1._0_4_ = 0;
            while( true ) {
              uVar10 = (ulong)(uint)offset_1;
              pvVar7 = std::
                       vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     *)offset_table,(ulong)dx);
              pvVar9 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::operator[](pvVar7,(ulong)offset_1._4_4_);
              sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar9);
              if (sVar6 <= uVar10) break;
              local_1b0 = ((chunk_offset_table_list.
                            super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->offsets).
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              tinyexr::swap8((tinyexr_uint64 *)&local_1b0);
              if (err_local <= local_1b0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_1d0,"Invalid offset size in EXR header chunks.",
                           (allocator *)((long)&i_2 + 7));
                tinyexr::SetErrorMessage(&local_1d0,local_40);
                std::__cxx11::string::~string((string *)&local_1d0);
                std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 7));
                exr_images_local._4_4_ = -4;
                num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                goto LAB_001100bb;
              }
              p_Var1 = &local_1b0->
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ;
              pvVar7 = std::
                       vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     *)offset_table,(ulong)dx);
              pvVar9 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::operator[](pvVar7,(ulong)offset_1._4_4_);
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (pvVar9,(ulong)(uint)offset_1);
              *pvVar8 = (value_type)((long)&p_Var1->_M_impl + 4);
              chunk_offset_table_list.
              super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)&((chunk_offset_table_list.
                               super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->offsets).
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
              offset_1._0_4_ = (uint)offset_1 + 1;
            }
            offset_1._4_4_ = offset_1._4_4_ + 1;
          }
        }
      }
    }
    for (offset_data_1 = (OffsetData *)0x0; offset_data_1 < (OffsetData *)(ulong)memory_local._4_4_;
        offset_data_1 =
             (OffsetData *)
             ((long)&(offset_data_1->offsets).
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1)) {
      _dy_1 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::operator[]
                        ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)&i_1,
                         (size_type)offset_data_1);
      for (dx_1 = 0; uVar10 = (ulong)dx_1,
          sVar6 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::size(&_dy_1->offsets), uVar10 < sVar6; dx_1 = dx_1 + 1) {
        local_1f0 = 0;
        while( true ) {
          uVar10 = (ulong)local_1f0;
          pvVar7 = std::
                   vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ::operator[](&_dy_1->offsets,(ulong)dx_1);
          sVar6 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size(pvVar7);
          if (sVar6 <= uVar10) break;
          part_number_addr._4_4_ = 0;
          while( true ) {
            uVar10 = (ulong)part_number_addr._4_4_;
            pvVar7 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](&_dy_1->offsets,(ulong)dx_1);
            pvVar9 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar7,(ulong)local_1f0);
            sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar9);
            sVar3 = size_local;
            if (sVar6 <= uVar10) break;
            pvVar7 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](&_dy_1->offsets,(ulong)dx_1);
            pvVar9 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar7,(ulong)local_1f0);
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (pvVar9,(ulong)part_number_addr._4_4_);
            puStack_200 = (uint *)((sVar3 - 4) + *pvVar8);
            local_204 = *puStack_200;
            tinyexr::swap4(&local_204);
            if ((OffsetData *)(ulong)local_204 != offset_data_1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_228,"Invalid `part number\' in EXR header chunks.",
                         (allocator *)(e.field_2._M_local_buf + 0xf));
              tinyexr::SetErrorMessage(&local_228,local_40);
              std::__cxx11::string::~string((string *)&local_228);
              std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
              exr_images_local._4_4_ = -4;
              num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              goto LAB_001100bb;
            }
            part_number_addr._4_4_ = part_number_addr._4_4_ + 1;
          }
          local_1f0 = local_1f0 + 1;
        }
      }
      std::__cxx11::string::string((string *)local_250);
      iVar5 = tinyexr::DecodeChunk
                        ((EXRImage *)(exr_headers_local + (long)offset_data_1 * 6),
                         ppEStack_20[(long)offset_data_1],_dy_1,(uchar *)size_local,
                         (size_t)err_local,(string *)local_250);
      if (iVar5 == 0) {
        num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
      }
      else {
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          tinyexr::SetErrorMessage((string *)local_250,local_40);
        }
        num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
        exr_images_local._4_4_ = iVar5;
      }
      std::__cxx11::string::~string((string *)local_250);
      if ((int)num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != 0) goto LAB_001100bb;
    }
    exr_images_local._4_4_ = 0;
    num_x_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
LAB_001100bb:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
              ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)&i_1);
  }
  return exr_images_local._4_4_;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        if (!tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i])) {
          tinyexr::SetErrorMessage("Invalid tile info.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}